

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O1

_Bool is_builtin_operator(int c)

{
  if (((0x3d < c - 0x21U) || ((0x340000007e007fb1U >> ((ulong)(c - 0x21U) & 0x3f) & 1) == 0)) &&
     (3 < c - 0x7bU)) {
    return false;
  }
  return true;
}

Assistant:

static inline bool is_builtin_operator (int c) {
    // PARENTHESIS
    // { } [ ] ( )
    // PUNCTUATION
    // . ; : ? ,
    // OPERATORS
    // + - * / < > ! = | & ^ % ~

    return ((c == '+') || (c == '-') || (c == '*') || (c == '/') ||
            (c == '<') || (c == '>') || (c == '!') || (c == '=') ||
            (c == '|') || (c == '&') || (c == '^') || (c == '%') ||
            (c == '~') || (c == '.') || (c == ';') || (c == ':') ||
            (c == '?') || (c == ',') || (c == '{') || (c == '}') ||
            (c == '[') || (c == ']') || (c == '(') || (c == ')') );
}